

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O2

void __thiscall Instruction::~Instruction(Instruction *this)

{
  this->_vptr_Instruction = (_func_int **)&PTR__Instruction_00118bd8;
  std::__cxx11::string::~string((string *)&this->m_text);
  return;
}

Assistant:

Instruction::~Instruction() {
}